

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageField
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  byte *pbVar1;
  bool bVar2;
  FieldDescriptorProto_Label local_3c;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_38;
  
  bVar2 = ParseLabel(this,&local_3c,field_location,(FileDescriptorProto *)parent_location);
  if (bVar2) {
    local_38 = messages;
    FieldDescriptorProto::_internal_set_label(field,local_3c);
    messages = local_38;
    if (local_3c == FieldDescriptorProto_Label_LABEL_OPTIONAL) {
      bVar2 = std::operator==(&this->syntax_identifier_,"proto3");
      if (bVar2) {
        pbVar1 = (byte *)((long)(field->_has_bits_).has_bits_ + 1);
        *pbVar1 = *pbVar1 | 1;
        field->proto3_optional_ = true;
      }
    }
  }
  bVar2 = ParseMessageFieldNoLabel
                    (this,field,messages,parent_location,location_field_number_for_nested_type,
                     field_location,containing_file);
  return bVar2;
}

Assistant:

bool Parser::ParseMessageField(FieldDescriptorProto* field,
                               RepeatedPtrField<DescriptorProto>* messages,
                               const LocationRecorder& parent_location,
                               int location_field_number_for_nested_type,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  {
    FieldDescriptorProto::Label label;
    if (ParseLabel(&label, field_location, containing_file)) {
      field->set_label(label);
      if (label == FieldDescriptorProto::LABEL_OPTIONAL &&
          syntax_identifier_ == "proto3") {
        field->set_proto3_optional(true);
      }
    }
  }

  return ParseMessageFieldNoLabel(field, messages, parent_location,
                                  location_field_number_for_nested_type,
                                  field_location, containing_file);
}